

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O1

void sga_pack_unpack(Integer g_src,Integer g_dst,Integer g_msk,Integer lo,Integer hi,Integer *icount
                    ,Integer pack)

{
  undefined8 *puVar1;
  long *plVar2;
  float fVar3;
  double dVar4;
  undefined8 uVar5;
  Integer nelem;
  logical lVar6;
  void *__s;
  void *buf;
  double *pdVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  char *string;
  long lVar12;
  Integer IVar13;
  long lVar14;
  Integer elems;
  Integer hip;
  Integer lop;
  void *ptr;
  Integer lop_1;
  Integer dst_lo;
  Integer ONE;
  Integer type_msk;
  Integer type_src;
  Integer dst_hi;
  Integer type_dst;
  Integer ndim_msk;
  Integer ndim_dst;
  Integer ndim_src;
  Integer dims;
  Integer local_d8;
  Integer local_d0;
  Integer local_c8;
  void *local_c0;
  long local_b8;
  long local_b0;
  void *local_a8;
  long local_a0;
  Integer local_98;
  Integer local_90;
  Integer local_88;
  long local_80;
  Integer local_78;
  long local_70;
  long local_68;
  long local_60;
  int local_58;
  undefined4 uStack_54;
  long local_50;
  long local_48;
  long local_40;
  Integer local_38;
  
  local_d0 = 0;
  local_c8 = lo;
  local_a8 = (void *)hi;
  nelem = pnga_nnodes();
  local_88 = pnga_nodeid();
  pnga_check_handle(g_src,"ga_pack src");
  pnga_check_handle(g_dst,"ga_pack dst");
  pnga_check_handle(g_msk,"ga_pack msk");
  local_98 = g_src;
  pnga_inquire(g_src,&local_68,&local_40,&local_38);
  local_90 = g_dst;
  pnga_inquire(g_dst,(Integer *)&local_58,&local_48,&local_38);
  pnga_inquire(g_msk,&local_70,&local_50,&local_38);
  if (local_40 != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: src",local_40);
  }
  if (local_48 != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: dst",local_48);
  }
  IVar13 = local_c8;
  if (local_50 != 1) {
    pnga_error("ga_pack: supports 1-dim arrays only: msk",local_50);
  }
  if (local_68 != CONCAT44(uStack_54,local_58)) {
    pnga_error("ga_pack: src and dst must be same type",0);
  }
  if (pack == 1) {
    lVar6 = pnga_compare_distr(local_98,g_msk);
    if (lVar6 != 0) goto LAB_00137671;
    string = "ga_pack: src and msk distributions differ";
  }
  else {
    lVar6 = pnga_compare_distr(local_90,g_msk);
    if (lVar6 != 0) goto LAB_00137671;
    string = "ga_unpack: dst and msk distributions differ";
  }
  pnga_error(string,0);
LAB_00137671:
  pnga_sync();
  __s = pnga_malloc(nelem,0x3ea,"ga_pack lim buf");
  memset(__s,0,nelem * 8);
  pnga_distribution(g_msk,local_88,&local_b8,(Integer *)&local_c0);
  local_88 = g_msk;
  if (local_b8 < 1) {
    lVar11 = -1;
  }
  else {
    local_a0 = local_b8 + -1;
    if (local_b8 < IVar13) {
      local_b8 = IVar13;
    }
    if ((long)local_a8 < (long)local_c0) {
      local_c0 = local_a8;
    }
    lVar11 = -1;
    if ((local_b8 <= (long)local_a8) && (IVar13 <= (long)local_c0)) {
      local_78 = 1;
      pnga_locate_nnodes(g_msk,&local_78,&local_a0,&local_d0);
      pnga_access_ptr(g_msk,&local_b8,(Integer *)&local_c0,&local_b0,&local_d8);
      local_d8 = (long)local_c0 + (1 - local_b8);
      lVar11 = -1;
      IVar13 = local_c8;
      switch(local_70) {
      case 0x3e9:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            if (*(int *)(local_b0 + lVar14 * 4) != 0) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
        break;
      case 0x3ea:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            if (*(long *)(local_b0 + lVar14 * 8) != 0) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
        break;
      case 0x3eb:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            fVar3 = *(float *)(local_b0 + lVar14 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
        break;
      case 0x3ec:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            dVar4 = *(double *)(local_b0 + lVar14 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
        break;
      default:
        break;
      case 0x3ee:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            fVar3 = *(float *)(local_b0 + lVar14 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_b0 + 4 + lVar14 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
        break;
      case 0x3ef:
        if (0 < local_d8) {
          pdVar7 = (double *)(local_b0 + 8);
          lVar14 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar14 < local_d8);
        }
        break;
      case 0x3f8:
        if (0 < local_d8) {
          lVar14 = 0;
          do {
            if (*(long *)(local_b0 + lVar14 * 8) != 0) {
              if (lVar11 < 0) {
                lVar11 = lVar14;
              }
              plVar2 = (long *)((long)__s + local_d0 * 8);
              *plVar2 = *plVar2 + 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_d8);
        }
      }
    }
  }
  pnga_gop(0x3ea,__s,nelem,"+");
  *icount = 0;
  if (nelem < 1) {
    lVar14 = 0;
  }
  else {
    lVar8 = *icount;
    lVar9 = 0;
    lVar14 = 0;
    do {
      if (lVar9 < local_d0) {
        lVar14 = lVar14 + *(long *)((long)__s + lVar9 * 8);
      }
      lVar8 = lVar8 + *(long *)((long)__s + lVar9 * 8);
      *icount = lVar8;
      lVar9 = lVar9 + 1;
    } while (nelem != lVar9);
  }
  if (((local_b8 <= (long)local_a8) && (IVar13 <= (long)local_c0)) &&
     (*(long *)((long)__s + local_d0 * 8) != 0)) {
    local_d8 = 0;
    buf = pnga_malloc(*(Integer *)((long)__s + local_d0 * 8),local_58,"ga pack buf");
    pnga_access_ptr(local_88,&local_b8,(Integer *)&local_c0,&local_d8,&local_a0);
    local_80 = lVar14 + 1;
    if (pack == 1) {
      local_78 = 0;
      local_60 = lVar14 + *(long *)((long)__s + local_d0 * 8);
      local_a8 = buf;
      pnga_access_ptr(local_98,&local_b8,(Integer *)&local_c0,&local_78,&local_a0);
      buf = local_a8;
      lVar14 = *(long *)((long)__s + local_d0 * 8);
      lVar8 = (long)local_c0 - local_b8;
      switch(local_70 + local_68 * 0x11) {
      case 0x4662:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4663:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4664:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4665:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4666:
      case 0x4669:
      case 0x466a:
      case 0x466b:
      case 0x466c:
      case 0x466d:
      case 0x466e:
      case 0x466f:
      case 0x4670:
      case 0x4672:
      case 0x4677:
      case 0x467a:
      case 0x467b:
      case 0x467c:
      case 0x467d:
      case 0x467e:
      case 0x467f:
      case 0x4680:
      case 0x4681:
      case 0x4683:
      case 0x4688:
      case 0x468b:
      case 0x468c:
      case 0x468d:
      case 0x468e:
      case 0x468f:
      case 0x4690:
      case 0x4691:
      case 0x4692:
      case 0x4694:
      case 0x4699:
      case 0x469c:
      case 0x469d:
      case 0x469e:
      case 0x469f:
      case 0x46a0:
      case 0x46a1:
      case 0x46a2:
      case 0x46a3:
        break;
      case 0x4667:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4668:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4671:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4673:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4674:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4675:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4676:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4678:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4679:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4682:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4684:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4685:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4686:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4687:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4689:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x468a:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4693:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)((long)local_a8 + lVar9 * 4) = *(undefined4 *)(local_78 + lVar11 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4695:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4696:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4697:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4698:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x469a:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x469b:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x46a4:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      default:
        local_70 = local_68 * 0x11 + local_70;
        switch(local_70) {
        case 0x46b7:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46b8:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46b9:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46ba:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              dVar4 = *(double *)(local_d8 + lVar11 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46bb:
        case 0x46be:
        case 0x46bf:
        case 0x46c0:
        case 0x46c1:
        case 0x46c2:
        case 0x46c3:
        case 0x46c4:
        case 0x46c5:
        case 0x46c7:
        case 0x46cc:
        case 0x46cf:
        case 0x46d0:
        case 0x46d1:
        case 0x46d2:
        case 0x46d3:
        case 0x46d4:
        case 0x46d5:
        case 0x46d6:
          break;
        case 0x46bc:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 8);
              if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                 ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46bd:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
            lVar9 = 0;
            do {
              if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7))
                 ) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              pdVar7 = pdVar7 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46c6:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                *(undefined8 *)((long)local_a8 + lVar9 * 8) = *(undefined8 *)(local_78 + lVar11 * 8)
                ;
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46c8:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46c9:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46ca:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46cb:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              dVar4 = *(double *)(local_d8 + lVar11 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46cd:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 8);
              if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                 ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46ce:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = lVar11 << 4;
            lVar12 = 0;
            do {
              if ((((*(double *)(local_d8 + lVar9) != 0.0) || (NAN(*(double *)(local_d8 + lVar9))))
                  || (dVar4 = *(double *)(local_d8 + 8 + lVar9), dVar4 != 0.0)) || (NAN(dVar4))) {
                uVar5 = ((undefined8 *)(local_78 + lVar9))[1];
                puVar10 = (undefined8 *)((long)local_a8 + lVar12 * 0x10);
                *puVar10 = *(undefined8 *)(local_78 + lVar9);
                puVar10[1] = uVar5;
                lVar12 = lVar12 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (lVar12 < lVar14);
          }
          break;
        case 0x46d7:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                uVar5 = puVar10[1];
                puVar1 = (undefined8 *)((long)local_a8 + lVar9 * 0x10);
                *puVar1 = *puVar10;
                puVar1[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        default:
          switch(local_70) {
          case 0x4761:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4762:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4763:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                fVar3 = *(float *)(local_d8 + lVar11 * 4);
                if ((fVar3 != 0.0) || (NAN(fVar3))) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4764:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                dVar4 = *(double *)(local_d8 + lVar11 * 8);
                if ((dVar4 != 0.0) || (NAN(dVar4))) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4766:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                fVar3 = *(float *)(local_d8 + lVar11 * 8);
                if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                   ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3)))))
                {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4767:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
              lVar9 = 0;
              do {
                if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) ||
                   (NAN(*pdVar7))) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
                if (lVar8 <= lVar11) break;
                lVar11 = lVar11 + 1;
                pdVar7 = pdVar7 + 2;
              } while (lVar9 < lVar14);
            }
            break;
          case 0x4770:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                  *(undefined8 *)((long)local_a8 + lVar9 * 8) =
                       *(undefined8 *)(local_78 + lVar11 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
          }
        }
      }
      pnga_put(local_90,&local_80,&local_60,local_a8,&local_a0);
      pnga_release(local_98,&local_b8,(Integer *)&local_c0);
    }
    else {
      local_78 = 0;
      local_60 = lVar14 + *(long *)((long)__s + local_d0 * 8);
      pnga_access_ptr(local_90,&local_b8,(Integer *)&local_c0,&local_78,&local_a0);
      pnga_get(local_98,&local_80,&local_60,buf,&local_a0);
      lVar14 = *(long *)((long)__s + local_d0 * 8);
      lVar8 = (long)local_c0 - local_b8;
      switch(local_70 + local_68 * 0x11) {
      case 0x4662:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4663:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4664:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4665:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4666:
      case 0x4669:
      case 0x466a:
      case 0x466b:
      case 0x466c:
      case 0x466d:
      case 0x466e:
      case 0x466f:
      case 0x4670:
      case 0x4672:
      case 0x4677:
      case 0x467a:
      case 0x467b:
      case 0x467c:
      case 0x467d:
      case 0x467e:
      case 0x467f:
      case 0x4680:
      case 0x4681:
      case 0x4683:
      case 0x4688:
      case 0x468b:
      case 0x468c:
      case 0x468d:
      case 0x468e:
      case 0x468f:
      case 0x4690:
      case 0x4691:
      case 0x4692:
      case 0x4694:
      case 0x4699:
      case 0x469c:
      case 0x469d:
      case 0x469e:
      case 0x469f:
      case 0x46a0:
      case 0x46a1:
      case 0x46a2:
      case 0x46a3:
        break;
      case 0x4667:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4668:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4671:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4673:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4674:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4675:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4676:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4678:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4679:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4682:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4684:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4685:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4686:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4687:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4689:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x468a:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x4693:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined4 *)(local_78 + lVar11 * 4) = *(undefined4 *)((long)buf + lVar9 * 4);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4695:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(int *)(local_d8 + lVar11 * 4) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4696:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4697:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 4);
            if ((fVar3 != 0.0) || (NAN(fVar3))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x4698:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            dVar4 = *(double *)(local_d8 + lVar11 * 8);
            if ((dVar4 != 0.0) || (NAN(dVar4))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x469a:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            fVar3 = *(float *)(local_d8 + lVar11 * 8);
            if (((fVar3 != 0.0) || (NAN(fVar3))) ||
               ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      case 0x469b:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
          lVar9 = 0;
          do {
            if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7)))
            {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
            if (lVar8 <= lVar11) break;
            lVar11 = lVar11 + 1;
            pdVar7 = pdVar7 + 2;
          } while (lVar9 < lVar14);
        }
        break;
      case 0x46a4:
        if ((0 < lVar14) && (lVar11 <= lVar8)) {
          lVar9 = 0;
          do {
            if (*(long *)(local_d8 + lVar11 * 8) != 0) {
              *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
              lVar9 = lVar9 + 1;
            }
          } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
        }
        break;
      default:
        local_70 = local_68 * 0x11 + local_70;
        switch(local_70) {
        case 0x46b7:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46b8:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46b9:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46ba:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              dVar4 = *(double *)(local_d8 + lVar11 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46bb:
        case 0x46be:
        case 0x46bf:
        case 0x46c0:
        case 0x46c1:
        case 0x46c2:
        case 0x46c3:
        case 0x46c4:
        case 0x46c5:
        case 0x46c7:
        case 0x46cc:
        case 0x46cf:
        case 0x46d0:
        case 0x46d1:
        case 0x46d2:
        case 0x46d3:
        case 0x46d4:
        case 0x46d5:
        case 0x46d6:
          break;
        case 0x46bc:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 8);
              if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                 ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46bd:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
            lVar9 = 0;
            do {
              if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) || (NAN(*pdVar7))
                 ) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              pdVar7 = pdVar7 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46c6:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                lVar9 = lVar9 + 1;
              }
            } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
          }
          break;
        case 0x46c8:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46c9:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46ca:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 4);
              if ((fVar3 != 0.0) || (NAN(fVar3))) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46cb:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              dVar4 = *(double *)(local_d8 + lVar11 * 8);
              if ((dVar4 != 0.0) || (NAN(dVar4))) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46cd:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              fVar3 = *(float *)(local_d8 + lVar11 * 8);
              if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                 ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3))))) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        case 0x46ce:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            lVar9 = lVar11 << 4;
            lVar12 = 0;
            do {
              if ((((*(double *)(local_d8 + lVar9) != 0.0) || (NAN(*(double *)(local_d8 + lVar9))))
                  || (dVar4 = *(double *)(local_d8 + 8 + lVar9), dVar4 != 0.0)) || (NAN(dVar4))) {
                puVar10 = (undefined8 *)((long)buf + lVar12 * 0x10);
                uVar5 = puVar10[1];
                *(undefined8 *)(local_78 + lVar9) = *puVar10;
                ((undefined8 *)(local_78 + lVar9))[1] = uVar5;
                lVar12 = lVar12 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (lVar12 < lVar14);
          }
          break;
        case 0x46d7:
          if ((0 < lVar14) && (lVar11 <= lVar8)) {
            puVar10 = (undefined8 *)(local_78 + lVar11 * 0x10);
            lVar9 = 0;
            do {
              if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                puVar1 = (undefined8 *)((long)buf + lVar9 * 0x10);
                uVar5 = puVar1[1];
                *puVar10 = *puVar1;
                puVar10[1] = uVar5;
                lVar9 = lVar9 + 1;
              }
              if (lVar8 <= lVar11) break;
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + 2;
            } while (lVar9 < lVar14);
          }
          break;
        default:
          switch(local_70) {
          case 0x4761:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(int *)(local_d8 + lVar11 * 4) != 0) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4762:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4763:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                fVar3 = *(float *)(local_d8 + lVar11 * 4);
                if ((fVar3 != 0.0) || (NAN(fVar3))) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4764:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                dVar4 = *(double *)(local_d8 + lVar11 * 8);
                if ((dVar4 != 0.0) || (NAN(dVar4))) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4766:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                fVar3 = *(float *)(local_d8 + lVar11 * 8);
                if (((fVar3 != 0.0) || (NAN(fVar3))) ||
                   ((fVar3 = *(float *)(local_d8 + 4 + lVar11 * 8), fVar3 != 0.0 || (NAN(fVar3)))))
                {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
            break;
          case 0x4767:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              pdVar7 = (double *)(local_d8 + lVar11 * 0x10 + 8);
              lVar9 = 0;
              do {
                if ((((pdVar7[-1] != 0.0) || (NAN(pdVar7[-1]))) || (*pdVar7 != 0.0)) ||
                   (NAN(*pdVar7))) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
                if (lVar8 <= lVar11) break;
                lVar11 = lVar11 + 1;
                pdVar7 = pdVar7 + 2;
              } while (lVar9 < lVar14);
            }
            break;
          case 0x4770:
            if ((0 < lVar14) && (lVar11 <= lVar8)) {
              lVar9 = 0;
              do {
                if (*(long *)(local_d8 + lVar11 * 8) != 0) {
                  *(undefined8 *)(local_78 + lVar11 * 8) = *(undefined8 *)((long)buf + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                }
              } while ((lVar11 < lVar8) && (lVar11 = lVar11 + 1, lVar9 < lVar14));
            }
          }
        }
      }
      pnga_release_update(local_90,&local_b8,(Integer *)&local_c0);
    }
    pnga_free(buf);
  }
  pnga_free(__s);
  pnga_sync();
  return;
}

Assistant:

static void sga_pack_unpack(Integer g_src, Integer g_dst, Integer g_msk,
                            Integer lo, Integer hi, Integer* icount,
                            Integer pack)
{
    void *ptr;
    long *lim=NULL;
    Integer nproc, me, i, myplace, np=0, first=-1;
    Integer lop, hip, dims;
    Integer ndim_src, ndim_dst, ndim_msk;
    Integer type_src, type_dst, type_msk;

    nproc = pnga_nnodes();
    me = pnga_nodeid();

    pnga_check_handle(g_src, "ga_pack src");
    pnga_check_handle(g_dst, "ga_pack dst");
    pnga_check_handle(g_msk, "ga_pack msk");
    pnga_inquire(g_src, &type_src, &ndim_src, &dims);
    pnga_inquire(g_dst, &type_dst, &ndim_dst, &dims);
    pnga_inquire(g_msk, &type_msk, &ndim_msk, &dims);
    if (1 != ndim_src) {
        pnga_error("ga_pack: supports 1-dim arrays only: src", ndim_src);
    }
    if (1 != ndim_dst) {
        pnga_error("ga_pack: supports 1-dim arrays only: dst", ndim_dst);
    }
    if (1 != ndim_msk) {
        pnga_error("ga_pack: supports 1-dim arrays only: msk", ndim_msk);
    }
    if (type_src != type_dst) {
        pnga_error("ga_pack: src and dst must be same type", 0);
    }
    if (1 == pack) {
        if(!pnga_compare_distr(g_src, g_msk)) {
            pnga_error("ga_pack: src and msk distributions differ",0);
        }
    } else if (0 == pack) {
        if(!pnga_compare_distr(g_dst, g_msk)) {
            pnga_error("ga_unpack: dst and msk distributions differ",0);
        }
    } else {
        pnga_error("ga_pack/unpack bad pack flag",0);
    }

    pnga_sync();

    lim = (long*) pnga_malloc(nproc, MT_C_LONGINT, "ga_pack lim buf");
    bzero(lim,sizeof(long)*nproc);
    pnga_distribution(g_msk, me, &lop, &hip);

    /* how many elements do we have to copy? */
    if ( lop > 0 ){ /* we get 0 if no elements stored on this process */
        Integer lop_1 = lop-1;
        /* adjust the range of elements to be within <lo,hi> */
        if(lop < lo) lop = lo;
        if(hip > hi) hip = hi;
        if(hi <lop || hip <lo); /* we have no elements to update */
        else{
            Integer elems, ONE=1;
            pnga_locate_nnodes(g_msk, &ONE, &lop_1, &np);
            pnga_access_ptr(g_msk, &lop, &hip, &ptr, &elems);
            elems = hip-lop+1;
            switch (type_msk) {
#define TYPE_CASE(MT,T,AT) case MT:                                         \
                {                                                           \
                    T * restrict aptr = (T*)ptr;                            \
                    for (i=0; i<elems; i++) {                               \
                        if (neq_zero_##AT(aptr[i])) {                       \
                            if (first<0) first=i;                           \
                            lim[np]++;                                      \
                        }                                                   \
                    }                                                       \
                    break;                                                  \
                }
#include "types.xh"
#undef TYPE_CASE
            }
        }
    }

    /* find number of elements everybody else is contributing */
    pnga_gop(C_LONG,lim,nproc,"+");

    for(i= myplace= *icount= 0; i<nproc; i++){
        if(i<np) myplace += lim[i];
        *icount += lim[i];
    }

    if(hi<lop || hip<lo || lim[np]==0 ); /* we have no elements to update */
    else{
        Integer ignore;
        void *buf=NULL, *msk=NULL;
        buf = pnga_malloc(lim[np], type_dst, "ga pack buf");
        pnga_access_ptr(g_msk, &lop, &hip, &msk, &ignore);
        if (1 == pack) {
            void *src=NULL;
            Integer dst_lo=myplace+1, dst_hi=myplace+lim[np];
            pnga_access_ptr(g_src, &lop, &hip, &src, &ignore);
            sga_pack(first, lim[np], hip-lop+1,
                     type_src, type_msk, src, buf, msk);
            pnga_put(g_dst, &dst_lo, &dst_hi, buf, &ignore);
            pnga_release(g_src, &lop, &hip);
        } else if (0 == pack) {
            void *dst=NULL;
            Integer src_lo=myplace+1, src_hi=myplace+lim[np];
            pnga_access_ptr(g_dst, &lop, &hip, &dst, &ignore);
            pnga_get(g_src, &src_lo, &src_hi, buf, &ignore);
            sga_unpack(first, lim[np], hip-lop+1,
                       type_src, type_msk, buf, dst, msk);
            pnga_release_update(g_dst, &lop, &hip);
        }
        pnga_free(buf);
    }
    pnga_free(lim);
    pnga_sync();
}